

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationweights.cpp
# Opt level: O0

UBool __thiscall
icu_63::CollationWeights::allocWeightsInShortRanges
          (CollationWeights *this,int32_t n,int32_t minLength)

{
  bool bVar1;
  UErrorCode local_28;
  int local_24;
  UErrorCode errorCode;
  int32_t i;
  int32_t minLength_local;
  int32_t n_local;
  CollationWeights *this_local;
  
  local_24 = 0;
  i = n;
  while( true ) {
    bVar1 = false;
    if (local_24 < this->rangeCount) {
      bVar1 = this->ranges[local_24].length <= minLength + 1;
    }
    if (!bVar1) break;
    if (i <= this->ranges[local_24].count) {
      if (minLength < this->ranges[local_24].length) {
        this->ranges[local_24].count = i;
      }
      this->rangeCount = local_24 + 1;
      if (1 < this->rangeCount) {
        local_28 = U_ZERO_ERROR;
        errorCode = minLength;
        _minLength_local = this;
        uprv_sortArray_63(this->ranges,this->rangeCount,0x10,compareRanges,(void *)0x0,'\0',
                          &local_28);
      }
      return '\x01';
    }
    i = i - this->ranges[local_24].count;
    local_24 = local_24 + 1;
  }
  return '\0';
}

Assistant:

UBool
CollationWeights::allocWeightsInShortRanges(int32_t n, int32_t minLength) {
    // See if the first few minLength and minLength+1 ranges have enough weights.
    for(int32_t i = 0; i < rangeCount && ranges[i].length <= (minLength + 1); ++i) {
        if(n <= ranges[i].count) {
            // Use the first few minLength and minLength+1 ranges.
            if(ranges[i].length > minLength) {
                // Reduce the number of weights from the last minLength+1 range
                // which might sort before some minLength ranges,
                // so that we use all weights in the minLength ranges.
                ranges[i].count = n;
            }
            rangeCount = i + 1;
#ifdef UCOL_DEBUG
            printf("take first %ld ranges\n", rangeCount);
#endif

            if(rangeCount>1) {
                /* sort the ranges by weight values */
                UErrorCode errorCode=U_ZERO_ERROR;
                uprv_sortArray(ranges, rangeCount, sizeof(WeightRange),
                               compareRanges, NULL, FALSE, &errorCode);
                /* ignore error code: we know that the internal sort function will not fail here */
            }
            return TRUE;
        }
        n -= ranges[i].count;  // still >0
    }
    return FALSE;
}